

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16collationiterator.cpp
# Opt level: O2

UBool __thiscall
icu_63::FCDUTF16CollationIterator::normalize
          (FCDUTF16CollationIterator *this,UChar *from,UChar *to,UErrorCode *errorCode)

{
  short sVar1;
  UBool UVar2;
  char16_t *pcVar3;
  int iVar4;
  
  Normalizer2Impl::decompose
            (this->nfcImpl,from,to,&this->normalized,(int32_t)((ulong)((long)to - (long)from) >> 1),
             errorCode);
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    this->segmentStart = from;
    this->segmentLimit = to;
    pcVar3 = UnicodeString::getBuffer(&this->normalized);
    (this->super_UTF16CollationIterator).start = pcVar3;
    sVar1 = (this->normalized).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar4 = (this->normalized).fUnion.fFields.fLength;
    }
    else {
      iVar4 = (int)sVar1 >> 5;
    }
    (this->super_UTF16CollationIterator).limit = pcVar3 + iVar4;
    UVar2 = '\x01';
  }
  else {
    UVar2 = '\0';
  }
  return UVar2;
}

Assistant:

UBool
FCDUTF16CollationIterator::normalize(const UChar *from, const UChar *to, UErrorCode &errorCode) {
    // NFD without argument checking.
    U_ASSERT(U_SUCCESS(errorCode));
    nfcImpl.decompose(from, to, normalized, (int32_t)(to - from), errorCode);
    if(U_FAILURE(errorCode)) { return FALSE; }
    // Switch collation processing into the FCD buffer
    // with the result of normalizing [segmentStart, segmentLimit[.
    segmentStart = from;
    segmentLimit = to;
    start = normalized.getBuffer();
    limit = start + normalized.length();
    return TRUE;
}